

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O1

void Ssc_GiaClassesCheckPairs(Gia_Man_t *p,Vec_Int_t *vDisPairs)

{
  long lVar1;
  
  if (1 < vDisPairs->nSize) {
    lVar1 = 1;
    do {
      if (vDisPairs->pArray[lVar1 + -1] == ((uint)p->pReprs[vDisPairs->pArray[lVar1]] & 0xfffffff))
      {
        printf("Pair (%d, %d) are still equivalent.\n");
      }
      lVar1 = lVar1 + 2;
    } while ((int)lVar1 < vDisPairs->nSize);
  }
  return;
}

Assistant:

void Ssc_GiaClassesCheckPairs( Gia_Man_t * p, Vec_Int_t * vDisPairs )
{
    int i, iRepr, iObj, Result = 1;
    Vec_IntForEachEntryDouble( vDisPairs, iRepr, iObj, i )
        if ( iRepr == Gia_ObjRepr(p, iObj) )
            printf( "Pair (%d, %d) are still equivalent.\n", iRepr, iObj ), Result = 0;
//    if ( Result )
//        printf( "Classes are refined correctly.\n" );
}